

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall perfetto::Category::Category(Category *this,char *name_)

{
  NameSizes NVar1;
  char *pcVar2;
  
  pcVar2 = CheckIsValidCategory(name_);
  this->name = pcVar2;
  this->description = (char *)0x0;
  (this->tags)._M_elems[0] = (char *)0x0;
  (this->tags)._M_elems[1] = (char *)0x0;
  (this->tags)._M_elems[2] = (char *)0x0;
  (this->tags)._M_elems[3] = (char *)0x0;
  NVar1 = ComputeNameSizes(name_);
  *&(this->name_sizes_)._M_elems = NVar1._M_elems;
  return;
}

Assistant:

constexpr explicit Category(const char* name_)
      : name(CheckIsValidCategory(name_)),
        name_sizes_(ComputeNameSizes(name_)) {}